

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O2

void __thiscall Game::setStartingLocationOfPlayers(Game *this)

{
  Player *this_00;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  char *pcVar4;
  int selection;
  uint local_44;
  pointer local_40;
  pointer local_38;
  
  local_40 = players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_38 = players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
             super__Vector_impl_data._M_start;
LAB_0010f1d1:
  if (local_38 == local_40) {
    return;
  }
  this_00 = *local_38;
  do {
    local_44 = 0xffffffff;
    poVar2 = std::operator<<((ostream *)&std::cout,"Which region do you want to start at : ");
    psVar3 = Player::getPlayerName_abi_cxx11_(this_00);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2,"?");
    std::endl<char,std::char_traits<char>>(poVar2);
    Map::showMapWithOwners(this->newYork);
    std::istream::operator>>((istream *)&std::cin,(int *)&local_44);
    pcVar4 = "You cannot start in Manhattan! ";
    if (((local_44 != 0) && (pcVar4 = "You cannot start in a Manhattan subregion! ", 6 < local_44))
       && (pcVar4 = "Must select number between 0-10 !", -1 < (int)local_44)) {
      bVar1 = Map::isRegionFull(this->newYork,local_44);
      pcVar4 = "The location you selected is full : Has 2 players in it already ";
      if (!bVar1) break;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
  } while( true );
  Map::setRegionOwner(this->newYork,local_44,this_00);
  local_38 = local_38 + 1;
  goto LAB_0010f1d1;
}

Assistant:

void Game::setStartingLocationOfPlayers() {

    for (auto player : players) {

        bool selected = true;
        while(selected){
            int selection= -1;
            cout << "Which region do you want to start at : " << player->getPlayerName() << "?" << endl;
            newYork->showMapWithOwners();
            cin >> selection;

            if(selection == 0){  // Manhattan
                cout << "You cannot start in Manhattan! " << endl;
            }
            else if (selection> 0 && selection<7){ // Manhattan subregions
                cout << "You cannot start in a Manhattan subregion! " << endl;
            }
            else if (selection < 0){ // Manhattan subregions
                cout << "Must select number between 0-10 !" << endl;
            }
            else {
                if(newYork->isRegionFull(selection)) {
                    cout << "The location you selected is full : Has 2 players in it already " << endl;
                }
                else {
                    newYork->setRegionOwner(selection, player);
                    selected = false;

                }

            }

        }
        continue;

   }

}